

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O1

void * qemu_ram_ptr_length(uc_struct_conflict15 *uc,RAMBlock *ram_block,ram_addr_t addr,hwaddr *size
                          ,_Bool lock)

{
  uint8_t *puVar1;
  ulong uVar2;
  
  if (*size == 0) {
    puVar1 = (uint8_t *)0x0;
  }
  else {
    if (ram_block == (RAMBlock *)0x0) {
      ram_block = qemu_get_ram_block(uc,addr);
      addr = addr - ram_block->offset;
    }
    uVar2 = ram_block->max_length - addr;
    if (*size < uVar2) {
      uVar2 = *size;
    }
    *size = uVar2;
    if ((ram_block->host == (uint8_t *)0x0) || (ram_block->used_length <= addr)) {
      __assert_fail("offset_in_ramblock(block, offset)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/exec/ram_addr.h"
                    ,0x22,"void *ramblock_ptr(RAMBlock *, ram_addr_t)");
    }
    puVar1 = ram_block->host + addr;
  }
  return puVar1;
}

Assistant:

static void *qemu_ram_ptr_length(struct uc_struct *uc, RAMBlock *ram_block, ram_addr_t addr,
                                 hwaddr *size, bool lock)
{
    RAMBlock *block = ram_block;
    if (*size == 0) {
        return NULL;
    }

    if (block == NULL) {
        block = qemu_get_ram_block(uc, addr);
        addr -= block->offset;
    }
    *size = MIN(*size, block->max_length - addr);

    return ramblock_ptr(block, addr);
}